

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

addrinfo * evutil_new_addrinfo_(sockaddr *sa,socklen_t socklen,addrinfo *hints)

{
  undefined1 local_70 [8];
  addrinfo tmp;
  addrinfo *r2;
  addrinfo *r1;
  addrinfo *res;
  addrinfo *hints_local;
  socklen_t socklen_local;
  sockaddr *sa_local;
  
  if (hints == (addrinfo *)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
               ,0x340,"hints","evutil_new_addrinfo_");
  }
  if ((hints->ai_socktype == 0) && (hints->ai_protocol == 0)) {
    memcpy(local_70,hints,0x30);
    tmp.ai_flags = 1;
    tmp.ai_family = 6;
    sa_local = (sockaddr *)evutil_new_addrinfo_(sa,socklen,(addrinfo *)local_70);
    if ((addrinfo *)sa_local == (addrinfo *)0x0) {
      sa_local = (sockaddr *)0x0;
    }
    else {
      tmp.ai_flags = 2;
      tmp.ai_family = 0x11;
      tmp.ai_next = evutil_new_addrinfo_(sa,socklen,(addrinfo *)local_70);
      if (tmp.ai_next == (addrinfo *)0x0) {
        evutil_freeaddrinfo((addrinfo *)sa_local);
        sa_local = (sockaddr *)0x0;
      }
      else {
        ((addrinfo *)sa_local)->ai_next = tmp.ai_next;
      }
    }
  }
  else {
    sa_local = (sockaddr *)event_mm_calloc_(1,(ulong)socklen + 0x30);
    if (sa_local == (sockaddr *)0x0) {
      sa_local = (sockaddr *)0x0;
    }
    else {
      *(sockaddr **)(sa_local[1].sa_data + 6) = sa_local + 3;
      memcpy(*(void **)(sa_local[1].sa_data + 6),sa,(ulong)socklen);
      sa_local[1].sa_family = (short)socklen;
      sa_local[1].sa_data[0] = (char)(socklen >> 0x10);
      sa_local[1].sa_data[1] = (char)(socklen >> 0x18);
      *(uint *)(sa_local->sa_data + 2) = (uint)sa->sa_family;
      sa_local->sa_family = 0;
      sa_local->sa_data[0] = '\0';
      sa_local->sa_data[1] = -0x80;
      *(int *)(sa_local->sa_data + 6) = hints->ai_socktype;
      *(int *)(sa_local->sa_data + 10) = hints->ai_protocol;
    }
  }
  return (addrinfo *)sa_local;
}

Assistant:

struct evutil_addrinfo *
evutil_new_addrinfo_(struct sockaddr *sa, ev_socklen_t socklen,
    const struct evutil_addrinfo *hints)
{
	struct evutil_addrinfo *res;
	EVUTIL_ASSERT(hints);

	if (hints->ai_socktype == 0 && hints->ai_protocol == 0) {
		/* Indecisive user! Give them a UDP and a TCP. */
		struct evutil_addrinfo *r1, *r2;
		struct evutil_addrinfo tmp;
		memcpy(&tmp, hints, sizeof(tmp));
		tmp.ai_socktype = SOCK_STREAM; tmp.ai_protocol = IPPROTO_TCP;
		r1 = evutil_new_addrinfo_(sa, socklen, &tmp);
		if (!r1)
			return NULL;
		tmp.ai_socktype = SOCK_DGRAM; tmp.ai_protocol = IPPROTO_UDP;
		r2 = evutil_new_addrinfo_(sa, socklen, &tmp);
		if (!r2) {
			evutil_freeaddrinfo(r1);
			return NULL;
		}
		r1->ai_next = r2;
		return r1;
	}

	/* We're going to allocate extra space to hold the sockaddr. */
	res = mm_calloc(1,sizeof(struct evutil_addrinfo)+socklen);
	if (!res)
		return NULL;
	res->ai_addr = (struct sockaddr*)
	    (((char*)res) + sizeof(struct evutil_addrinfo));
	memcpy(res->ai_addr, sa, socklen);
	res->ai_addrlen = socklen;
	res->ai_family = sa->sa_family; /* Same or not? XXX */
	res->ai_flags = EVUTIL_AI_LIBEVENT_ALLOCATED;
	res->ai_socktype = hints->ai_socktype;
	res->ai_protocol = hints->ai_protocol;

	return res;
}